

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O3

bool __thiscall
OSSLEVPSymmetricAlgorithm::decryptFinal(OSSLEVPSymmetricAlgorithm *this,ByteString *data)

{
  Type TVar1;
  EVP_CIPHER_CTX *pEVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  uchar *puVar6;
  undefined4 extraout_var;
  uchar *in;
  undefined4 extraout_var_00;
  size_t sVar7;
  ulong uVar8;
  char *pcVar9;
  size_t pos;
  int outLen;
  ByteString aeadBuffer;
  int local_5c;
  ByteString local_58;
  
  TVar1 = (this->super_SymmetricAlgorithm).currentCipherMode;
  uVar8 = (this->super_SymmetricAlgorithm).currentTagBytes;
  ByteString::ByteString(&local_58,&(this->super_SymmetricAlgorithm).currentAEADBuffer);
  bVar3 = SymmetricAlgorithm::decryptFinal(&this->super_SymmetricAlgorithm,data);
  if (bVar3) {
    ByteString::resize(data,0);
    if (TVar1 != GCM) {
LAB_0015b6a4:
      sVar5 = ByteString::size(data);
      iVar4 = (*(this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm[0xd])(this);
      pos = (size_t)(int)sVar5;
      ByteString::resize(data,CONCAT44(extraout_var_00,iVar4) + pos);
      sVar7 = ByteString::size(data);
      local_5c = (int)sVar7 - (int)sVar5;
      pEVar2 = (EVP_CIPHER_CTX *)this->pCurCTX;
      puVar6 = ByteString::operator[](data,pos);
      iVar4 = EVP_DecryptFinal(pEVar2,puVar6,&local_5c);
      bVar3 = iVar4 != 0;
      if (iVar4 == 0) {
        uVar8 = ERR_get_error();
        pcVar9 = ERR_error_string(uVar8,(char *)0x0);
        softHSMLog(3,"decryptFinal",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                   ,0x200,"EVP_DecryptFinal failed (0x%08X): %s",0,pcVar9);
      }
      else {
        ByteString::resize(data,(long)local_5c + pos);
      }
      clean(this);
      goto LAB_0015b755;
    }
    sVar5 = ByteString::size(&local_58);
    if (sVar5 < uVar8) {
      sVar5 = ByteString::size(&local_58);
      softHSMLog(3,"decryptFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0x1dd,"Tag bytes (%d) does not fit in AEAD buffer (%d)",uVar8,sVar5);
      goto LAB_0015b5db;
    }
    pEVar2 = (EVP_CIPHER_CTX *)this->pCurCTX;
    sVar5 = ByteString::size(&local_58);
    puVar6 = ByteString::operator[](&local_58,sVar5 - uVar8);
    EVP_CIPHER_CTX_ctrl(pEVar2,0x11,(int)uVar8,puVar6);
    sVar5 = ByteString::size(&local_58);
    iVar4 = (*(this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm[0xd])(this);
    ByteString::resize(data,(sVar5 - uVar8) + CONCAT44(extraout_var,iVar4));
    sVar5 = ByteString::size(data);
    local_5c = (int)sVar5;
    pEVar2 = (EVP_CIPHER_CTX *)this->pCurCTX;
    puVar6 = ByteString::operator[](data,0);
    in = ByteString::const_byte_str(&local_58);
    sVar5 = ByteString::size(&local_58);
    iVar4 = EVP_DecryptUpdate(pEVar2,puVar6,&local_5c,in,(int)sVar5 - (int)uVar8);
    if (iVar4 != 0) {
      ByteString::resize(data,(long)local_5c);
      goto LAB_0015b6a4;
    }
    uVar8 = ERR_get_error();
    pcVar9 = ERR_error_string(uVar8,(char *)0x0);
    softHSMLog(3,"decryptFinal",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
               ,0x1ed,"EVP_DecryptUpdate failed: %s",pcVar9);
    clean(this);
  }
  else {
LAB_0015b5db:
    clean(this);
  }
  bVar3 = false;
LAB_0015b755:
  local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_58.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return bVar3;
}

Assistant:

bool OSSLEVPSymmetricAlgorithm::decryptFinal(ByteString& data)
{
	SymMode::Type mode = currentCipherMode;
	size_t tagBytes = currentTagBytes;
	ByteString aeadBuffer = currentAEADBuffer;

	if (!SymmetricAlgorithm::decryptFinal(data))
	{
		clean();
		return false;
	}

	data.resize(0);
	if (mode == SymMode::GCM)
	{
		// Check buffer size
		if (aeadBuffer.size() < tagBytes)
		{
			ERROR_MSG("Tag bytes (%d) does not fit in AEAD buffer (%d)", tagBytes, aeadBuffer.size());

			clean();

			return false;
		}

		// Set the tag
		EVP_CIPHER_CTX_ctrl(pCurCTX, EVP_CTRL_GCM_SET_TAG, tagBytes, &aeadBuffer[aeadBuffer.size()-tagBytes]);

		// Prepare the output block
		data.resize(aeadBuffer.size() - tagBytes + getBlockSize());
		int outLen = data.size();

		if (!EVP_DecryptUpdate(pCurCTX, &data[0], &outLen, (unsigned char*) aeadBuffer.const_byte_str(), aeadBuffer.size() - tagBytes))
		{
			ERROR_MSG("EVP_DecryptUpdate failed: %s", ERR_error_string(ERR_get_error(), NULL));

			clean();

			return false;
		}

		data.resize(outLen);
	}

	// Prepare the output block
	int initialSize = data.size();
	data.resize(initialSize + getBlockSize());

	int outLen = data.size() - initialSize;
	int rv = EVP_DecryptFinal(pCurCTX, &data[initialSize], &outLen);

	if (!rv)
	{
		ERROR_MSG("EVP_DecryptFinal failed (0x%08X): %s", rv, ERR_error_string(ERR_get_error(), NULL));

		clean();

		return false;
	}

	// Resize the output block
	data.resize(initialSize + outLen);

	clean();

	return true;
}